

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_init_finish.c
# Opt level: O3

int dwarf_get_section_info_by_name_a
              (Dwarf_Debug dbg,char *section_name,Dwarf_Addr *section_addr,
              Dwarf_Unsigned *section_size,Dwarf_Unsigned *section_flags,
              Dwarf_Unsigned *section_offset,Dwarf_Error *error)

{
  Dwarf_Obj_Access_Interface_a_s *pDVar1;
  int iVar2;
  Dwarf_Unsigned DVar3;
  char *msg;
  Dwarf_Unsigned DVar4;
  int local_ac;
  Dwarf_Unsigned *local_a8;
  Dwarf_Addr *local_a0;
  Dwarf_Unsigned *local_98;
  Dwarf_Unsigned *local_90;
  Dwarf_Obj_Access_Section_a local_88;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    msg = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_section_info_by_name_a()either null or it containsa stale Dwarf_Debug pointer"
    ;
    dbg = (Dwarf_Debug)0x0;
  }
  else {
    if (section_addr != (Dwarf_Addr *)0x0) {
      *section_addr = 0;
    }
    if (section_size != (Dwarf_Unsigned *)0x0) {
      *section_size = 0;
    }
    if (section_flags != (Dwarf_Unsigned *)0x0) {
      *section_flags = 0;
    }
    if (section_offset != (Dwarf_Unsigned *)0x0) {
      *section_offset = 0;
    }
    if (section_name != (char *)0x0) {
      if (*section_name == '\0') {
        return -1;
      }
      pDVar1 = dbg->de_obj_file;
      if (pDVar1 == (Dwarf_Obj_Access_Interface_a_s *)0x0) {
        return -1;
      }
      local_a0 = section_addr;
      local_98 = section_size;
      local_90 = section_flags;
      DVar3 = (*pDVar1->ai_methods->om_get_section_count)(pDVar1->ai_object);
      if (DVar3 == 0) {
        return -1;
      }
      DVar4 = 0;
      local_a8 = section_offset;
      do {
        local_ac = 0;
        local_88.as_name = (char *)0x0;
        local_88.as_type = 0;
        local_88.as_flags = 0;
        local_88.as_addr = 0;
        local_88.as_offset = 0;
        local_88.as_size = 0;
        local_88.as_link = 0;
        local_88.as_info = 0;
        local_88.as_addralign = 0;
        local_88.as_entrysize = 0;
        iVar2 = (*pDVar1->ai_methods->om_get_section_info)
                          (pDVar1->ai_object,DVar4,&local_88,&local_ac);
        if (iVar2 != -1) {
          if (iVar2 == 1) {
            _dwarf_error(dbg,error,(long)local_ac);
            return 1;
          }
          iVar2 = strcmp(section_name,local_88.as_name);
          if (iVar2 == 0) {
            if (local_a0 != (Dwarf_Addr *)0x0) {
              *local_a0 = local_88.as_addr;
            }
            if (local_98 != (Dwarf_Unsigned *)0x0) {
              *local_98 = local_88.as_size;
            }
            if (local_90 != (Dwarf_Unsigned *)0x0) {
              *local_90 = local_88.as_flags;
            }
            if (local_a8 != (Dwarf_Unsigned *)0x0) {
              *local_a8 = local_88.as_offset;
              return 0;
            }
            return 0;
          }
        }
        DVar4 = DVar4 + 1;
        if (DVar3 == DVar4) {
          return -1;
        }
      } while( true );
    }
    msg = "DW_DLE_DBG_NULL: null section_name pointer passed to dwarf_get_section_info_by_name_a";
  }
  _dwarf_error_string(dbg,error,0x51,msg);
  return 1;
}

Assistant:

int
dwarf_get_section_info_by_name_a(Dwarf_Debug dbg,
    const char *section_name,
    Dwarf_Addr *section_addr,
    Dwarf_Unsigned *section_size,
    Dwarf_Unsigned *section_flags,
    Dwarf_Unsigned *section_offset,
    Dwarf_Error * error)
{
    struct Dwarf_Obj_Access_Interface_a_s * obj = 0;
    Dwarf_Unsigned section_count = 0;
    Dwarf_Unsigned section_index = 0;
    struct Dwarf_Obj_Access_Section_a_s doas;

    CHECK_DBG(dbg,error,"dwarf_get_section_info_by_name_a()");
    if (section_addr) {
        *section_addr = 0;
    }
    if (section_size) {
        *section_size = 0;
    }
    if (section_flags) {
        *section_flags = 0;
    }
    if (section_offset) {
        *section_offset = 0;
    }
    if (!section_name) {
        _dwarf_error_string(dbg,error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: null section_name pointer "
            "passed to "
            "dwarf_get_section_info_by_name_a");
        return DW_DLV_ERROR;
    }
    if (!section_name[0]) {
        return DW_DLV_NO_ENTRY;
    }
    obj = dbg->de_obj_file;
    if (!obj) {
        return DW_DLV_NO_ENTRY;
    }
    section_count = obj->ai_methods->
        om_get_section_count(obj->ai_object);

    /*  We can skip index 0 when considering ELF files, but not other
        object types. */
    for (section_index = 0; section_index < section_count;
        ++section_index) {
        int errnum = 0;
        int res = 0;

        doas = zerodoas;
        res = obj->ai_methods->
            om_get_section_info(obj->ai_object,
            section_index, &doas, &errnum);
        if (res == DW_DLV_ERROR) {
            DWARF_DBG_ERROR(dbg, errnum, DW_DLV_ERROR);
        }
        if (res == DW_DLV_NO_ENTRY) {
            /* This should be impossible */
            continue;
        }
        if (!strcmp(section_name,doas.as_name)) {
            if (section_addr) {
                *section_addr = doas.as_addr;
            }
            if (section_size) {
                *section_size = doas.as_size;
            }
            if (section_flags) {
                *section_flags = doas.as_flags;
            }
            if (section_offset) {
                *section_offset = doas.as_offset;
            }
            return DW_DLV_OK;
        }
    }
    return DW_DLV_NO_ENTRY;
}